

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface.cpp
# Opt level: O2

void __thiscall
QFutureInterfaceBase::setContinuation
          (QFutureInterfaceBase *this,QObject *context,function<void_()> func,
          QVariant *continuationFuture,ContinuationType type)

{
  ulong uVar1;
  PrivateShared *pPVar2;
  function<void_(const_QFutureInterfaceBase_&)> func_00;
  _Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  QCallableObject<std::function<void_()>,_QtPrivate::List<>,_void> *this_00;
  QObject *sender;
  QThread *pQVar5;
  QSlotObjectBase *slotObjRaw;
  QCallableObject<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_corelib_thread_qfutureinterface_cpp:952:33),_QtPrivate::List<>,_void>
  *pQVar6;
  QVariant *pQVar7;
  _func_void *p_Var8;
  undefined7 in_register_00000009;
  QVariant *p;
  ContinuationType type_00;
  long in_FS_OFFSET;
  undefined4 uVar9;
  undefined4 in_stack_fffffffffffffeec;
  undefined8 uVar10;
  QMetaObject *pQVar11;
  _Any_data local_f8;
  code *local_e8;
  code *pcStack_e0;
  undefined1 local_d8 [16];
  __uniq_ptr_impl<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter> local_c8;
  undefined1 local_c0 [8];
  anon_class_24_2_b535a69b_for_o local_b8;
  __shared_ptr<QRecursiveMutex,_(__gnu_cxx::_Lock_policy)2> local_98;
  _Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false> local_80;
  element_type *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_70;
  QPointer<QObjectContinuationWrapper> local_68;
  QVariant local_58;
  long local_38;
  
  p = (QVariant *)CONCAT71(in_register_00000009,type);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QCallableObject<std::function<void_()>,_QtPrivate::List<>,_void> *)operator_new(0x30);
  QtPrivate::QCallableObject<std::function<void_()>,_QtPrivate::List<>,_void>::QCallableObject
            (this_00,(function<void_()> *)continuationFuture);
  local_80._M_head_impl = (QSlotObjectBase *)this_00;
  sender = (QObject *)operator_new(0x10);
  QObjectContinuationWrapper::QObjectContinuationWrapper
            ((QObjectContinuationWrapper *)sender,(QObject *)0x0);
  pQVar5 = QObject::thread(context);
  QObject::moveToThread(sender,pQVar5);
  local_98._M_ptr = (element_type *)&DAT_aaaaaaaaaaaaaaaa;
  local_98._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&DAT_aaaaaaaaaaaaaaaa
  ;
  std::make_shared<QRecursiveMutex>();
  local_b8.watcher = (QObjectContinuationWrapper *)&DAT_aaaaaaaaaaaaaaaa;
  local_b8.watcherMutex.super___shared_ptr<QRecursiveMutex,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&DAT_aaaaaaaaaaaaaaaa;
  local_b8.watcherMutex.super___shared_ptr<QRecursiveMutex,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&DAT_aaaaaaaaaaaaaaaa;
  std::__shared_ptr<QRecursiveMutex,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QRecursiveMutex,_(__gnu_cxx::_Lock_policy)2> *)(local_c0 + 8),&local_98);
  _Var3._M_head_impl = local_80._M_head_impl;
  local_c8._M_t.
  super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>.
  super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>._M_head_impl =
       (tuple<QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>)
       (tuple<QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>)
       local_80._M_head_impl;
  local_80._M_head_impl = (QSlotObjectBase *)0x0;
  local_78 = (element_type *)QObjectContinuationWrapper::run;
  p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_b8.watcher = (QObjectContinuationWrapper *)sender;
  slotObjRaw = (QSlotObjectBase *)operator_new(0x18);
  (slotObjRaw->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 1;
  slotObjRaw->m_impl =
       QtPrivate::
       QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/corelib/thread/qfutureinterface.cpp:962:31),_QtPrivate::List<>,_void>
       ::impl;
  *(QSlotObjectBase **)(slotObjRaw + 1) = _Var3._M_head_impl;
  local_c8._M_t.
  super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>.
  super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>._M_head_impl =
       (tuple<QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>)
       (_Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>)0x0;
  QObject::connectImpl
            ((QObject *)local_c0,sender,&local_78,context,(void **)0x0,slotObjRaw,AutoConnection,
             (int *)0x0,&QObjectContinuationWrapper::staticMetaObject);
  QMetaObject::Connection::~Connection((Connection *)local_c0);
  std::unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>::~unique_ptr
            ((unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter> *)
             &local_c8);
  local_78 = (element_type *)QObjectContinuationWrapper::run;
  p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pQVar6 = (QCallableObject<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_corelib_thread_qfutureinterface_cpp:952:33),_QtPrivate::List<>,_void>
            *)operator_new(0x28);
  QtPrivate::
  QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/corelib/thread/qfutureinterface.cpp:952:33),_QtPrivate::List<>,_void>
  ::QCallableObject(pQVar6,(anon_class_24_2_b535a69b_for_o *)(local_c0 + 8));
  QObject::connectImpl
            ((QObject *)(local_d8 + 8),sender,&local_78,sender,(void **)0x0,
             (QSlotObjectBase *)pQVar6,AutoConnection,(int *)0x0,
             &QObjectContinuationWrapper::staticMetaObject);
  QMetaObject::Connection::~Connection((Connection *)(local_d8 + 8));
  local_78 = (element_type *)QObject::destroyed;
  p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pQVar6 = (QCallableObject<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_corelib_thread_qfutureinterface_cpp:952:33),_QtPrivate::List<>,_void>
            *)operator_new(0x28);
  QtPrivate::
  QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/corelib/thread/qfutureinterface.cpp:952:33),_QtPrivate::List<>,_void>
  ::QCallableObject(pQVar6,(anon_class_24_2_b535a69b_for_o *)(local_c0 + 8));
  uVar10 = 0;
  pQVar11 = &QObject::staticMetaObject;
  uVar9 = 0;
  QObject::connectImpl
            ((QObject *)local_d8,context,&local_78,sender,(void **)0x0,(QSlotObjectBase *)pQVar6,
             AutoConnection,(int *)0x0,&QObject::staticMetaObject);
  QMetaObject::Connection::~Connection((Connection *)local_d8);
  uVar1 = *(ulong *)&(p->d).field_0x18;
  if (uVar1 < 4) {
    type_00 = Unknown;
  }
  else {
    pQVar7 = p;
    if ((uVar1 & 1) != 0) {
      pPVar2 = (p->d).data.shared;
      pQVar7 = (QVariant *)
               ((long)&(pPVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
                       _q_value.super___atomic_base<int> + (long)pPVar2->offset);
    }
    type_00 = (ContinuationType)*(undefined8 *)((long)&(pQVar7->d).data + 8);
  }
  local_78 = local_98._M_ptr;
  p_Stack_70 = local_98._M_refcount._M_pi;
  local_98._M_ptr = (element_type *)0x0;
  local_98._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  QPointer<QObjectContinuationWrapper>::QPointer<void>
            (&local_68,(QObjectContinuationWrapper *)sender);
  ::QVariant::QVariant(&local_58,p);
  local_e8 = (code *)0x0;
  pcStack_e0 = (code *)0x0;
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  p_Var8 = (_func_void *)operator_new(0x40);
  p_Var4 = p_Stack_70;
  p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(element_type **)p_Var8 = local_78;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var8 + 8) = p_Var4;
  local_78 = (element_type *)0x0;
  *(Data **)(p_Var8 + 0x10) = local_68.wp.d;
  *(QObject **)(p_Var8 + 0x18) = local_68.wp.value;
  local_68.wp.d = (Data *)0x0;
  local_68.wp.value = (QObject *)0x0;
  ::QVariant::QVariant((QVariant *)(p_Var8 + 0x20),&local_58);
  pcStack_e0 = std::
               _Function_handler<void_(const_QFutureInterfaceBase_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/corelib/thread/qfutureinterface.cpp:988:21)>
               ::_M_invoke;
  local_e8 = std::
             _Function_handler<void_(const_QFutureInterfaceBase_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/corelib/thread/qfutureinterface.cpp:988:21)>
             ::_M_manager;
  func_00.super__Function_base._M_functor._4_4_ = in_stack_fffffffffffffeec;
  func_00.super__Function_base._M_functor._0_4_ = uVar9;
  func_00.super__Function_base._M_functor._8_8_ = uVar10;
  func_00.super__Function_base._M_manager = (_Manager_type)pQVar11;
  func_00._M_invoker = (_Invoker_type)this;
  local_f8._M_unused._0_8_ = (undefined8)p_Var8;
  setContinuation(this,func_00,&local_f8,type_00);
  std::_Function_base::~_Function_base((_Function_base *)&local_f8);
  setContinuation(QObject_const*,std::function<void()>,QVariant_const&,QFutureInterfaceBase::ContinuationType)
  ::$_2::~__2((__2 *)&local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b8.watcherMutex.super___shared_ptr<QRecursiveMutex,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98._M_refcount);
  std::unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>::~unique_ptr
            ((unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter> *)
             &local_80);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFutureInterfaceBase::setContinuation(const QObject *context, std::function<void()> func,
                                           const QVariant &continuationFuture,
                                           ContinuationType type)
{
    Q_ASSERT(context);

    using FuncType = void();
    using Prototype = typename QtPrivate::Callable<FuncType>::Function;
    auto slotObj = QtPrivate::makeCallableObject<Prototype>(std::move(func));

    auto slot = QtPrivate::SlotObjUniquePtr(slotObj);

    auto *watcher = new QObjectContinuationWrapper;
    watcher->moveToThread(context->thread());

   // We need to protect acccess to the watcher. The context object (and in turn, the watcher)
   // could be destroyed while the continuation that emits the signal is running. We have to
   // prevent that.
   // The mutex has to be recursive, because the continuation itself could delete the context
   // object (and thus the watcher), which will try to lock the mutex from the same thread twice.
    auto watcherMutex = std::make_shared<QRecursiveMutex>();
    const auto destroyWatcher = [watcherMutex, watcher]() mutable {
        QMutexLocker lock(watcherMutex.get());
        delete watcher;
    };

    // ### we're missing a convenient way to `QObject::connect()` to a `QSlotObjectBase`...
    QObject::connect(watcher, &QObjectContinuationWrapper::run,
                     // for the following, cf. QMetaObject::invokeMethodImpl():
                     // we know `slot` is a lambda returning `void`, so we can just
                     // `call()` with `obj` and `args[0]` set to `nullptr`:
                     context, [slot = std::move(slot)] {
                         void *args[] = { nullptr }; // for `void` return value
                         slot->call(nullptr, args);
                     });
    QObject::connect(watcher, &QObjectContinuationWrapper::run, watcher, destroyWatcher);

    // We need to connect to destroyWatcher here, instead of delete or deleteLater().
    // If the continuation is called from a separate thread, emit watcher->run() can't detect that
    // the watcher has been deleted in the separate thread, causing a race condition and potential
    // heap-use-after-free issue inside QObject::doActivate. destroyWatcher forces the deletion of
    // the watcher to occur after emit watcher->run() completes and prevents the race condition.
    QObject::connect(context, &QObject::destroyed, watcher, destroyWatcher);

    // Extract a QFutureInterfaceBasePrivate pointer from the QVariant. We rely
    // on the fact that QVariant contains QFutureInterface<T>.
    QFutureInterfaceBasePrivate *continuationFutureData = nullptr;
    if (continuationFuture.isValid()) {
        Q_ASSERT(QLatin1StringView(continuationFuture.typeName())
                         .startsWith(QLatin1StringView("QFutureInterface")));
        const auto continuationPtr =
                static_cast<const QFutureInterfaceBase *>(continuationFuture.constData());
        continuationFutureData = continuationPtr->d;
    }

    // Capture continuationFuture so that it lives as long as the continuation,
    // and the continuation data remains valid.
    setContinuation([watcherMutex = std::move(watcherMutex),
                     watcher = QPointer(watcher), continuationFuture]
                    (const QFutureInterfaceBase &parentData)
    {
        Q_UNUSED(parentData);
        Q_UNUSED(continuationFuture);
        QMutexLocker lock(watcherMutex.get());
        if (watcher)
            emit watcher->run();
    }, continuationFutureData, type);
}